

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_compression.c
# Opt level: O1

int decompress_certificate
              (ptls_decompress_certificate_t *self,ptls_t *tls,uint16_t algorithm,
              ptls_iovec_t output,ptls_iovec_t input)

{
  int iVar1;
  undefined6 in_register_00000012;
  size_t local_10;
  
  if ((((int)CONCAT62(in_register_00000012,algorithm) == 2) &&
      (local_10 = output.len,
      iVar1 = BrotliDecoderDecompress(input.len,input.base,&local_10,output.base), iVar1 == 1)) &&
     (local_10 == output.len)) {
    return 0;
  }
  return 0x2a;
}

Assistant:

static inline int decompress_certificate(ptls_decompress_certificate_t *self, ptls_t *tls, uint16_t algorithm, ptls_iovec_t output,
                                         ptls_iovec_t input)
{
    if (algorithm != PTLS_CERTIFICATE_COMPRESSION_ALGORITHM_BROTLI)
        goto Fail;

    size_t decoded_size = output.len;
    if (BrotliDecoderDecompress(input.len, input.base, &decoded_size, output.base) != BROTLI_DECODER_RESULT_SUCCESS)
        goto Fail;

    if (decoded_size != output.len)
        goto Fail;

    return 0;
Fail:
    return PTLS_ALERT_BAD_CERTIFICATE;
}